

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_ipoint.cpp
# Opt level: O1

bool __thiscall ON_4iRect::IntersectRect(ON_4iRect *this,ON_4iRect *r1,ON_4iRect *r2)

{
  ON__INT32 OVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  
  iVar4 = ON_Max(r1->left,r2->left);
  this->left = iVar4;
  iVar4 = ON_Min(r1->right,r2->right);
  this->right = iVar4;
  if (this->left < iVar4) {
    iVar4 = ON_Max(r1->top,r2->top);
    this->top = iVar4;
    iVar4 = ON_Min(r1->bottom,r2->bottom);
    this->bottom = iVar4;
    if (this->top < iVar4) {
      return true;
    }
  }
  uVar2 = Zero._8_8_;
  OVar1 = Zero.top;
  this->left = Zero.left;
  uVar3 = Zero._8_8_;
  this->top = OVar1;
  Zero.right = (ON__INT32)uVar2;
  Zero.bottom = SUB84(uVar2,4);
  OVar1 = Zero.bottom;
  this->right = Zero.right;
  Zero._8_8_ = uVar3;
  this->bottom = OVar1;
  return false;
}

Assistant:

bool ON_4iRect::IntersectRect(const ON_4iRect * r1, const ON_4iRect * r2)
{
  left = ON_Max(r1->left, r2->left);
  right = ON_Min(r1->right, r2->right);
  if (right > left)
  {
    top = ON_Max(r1->top, r2->top);
    bottom = ON_Min(r1->bottom, r2->bottom);
    if (bottom > top)
      return true;
  }

  // degenerate rectangle at this point...
  SetRectEmpty();
  return false;
}